

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O3

uint32_t address_space_ldl_internal_cached_slow_mips
                   (uc_struct_conflict4 *uc,MemoryRegionCache *cache,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  uint *puVar2;
  AddressSpace **target_as_00;
  IOMMUMemoryRegion *iommu_mr;
  hwaddr addr1;
  hwaddr l;
  AddressSpace *target_as;
  uint64_t val;
  ulong uVar3;
  undefined1 local_80 [8];
  MemoryRegionSection local_78;
  
  uVar3 = 4;
  if (cache->ptr == (void *)0x0) {
    target_as_00 = (AddressSpace **)(addr + cache->xlat);
    iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
    if ((((iommu_mr == (IOMMUMemoryRegion *)0x0) || ((iommu_mr->parent_obj).is_iommu == false)) ||
        (address_space_translate_iommu
                   (&local_78,iommu_mr,(hwaddr *)&stack0xffffffffffffff70,
                    (hwaddr *)&stack0xffffffffffffff78,(hwaddr *)0x0,SUB81(local_80,0),attrs._0_1_,
                    target_as_00,(MemTxAttrs)0x4), iommu_mr = (IOMMUMemoryRegion *)local_78.mr,
        3 < uVar3)) && (local_78.mr = &iommu_mr->parent_obj, (iommu_mr->parent_obj).ram != false)) {
      puVar2 = (uint *)qemu_map_ram_ptr_mips
                                 ((uc_struct_conflict4 *)(iommu_mr->parent_obj).uc,
                                  (iommu_mr->parent_obj).ram_block,(ram_addr_t)target_as_00);
      local_78.size._0_4_ = *puVar2;
      if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
        local_78.size._0_4_ =
             (uint)local_78.size >> 0x18 | ((uint)local_78.size & 0xff0000) >> 8 |
             ((uint)local_78.size & 0xff00) << 8 | (uint)local_78.size << 0x18;
      }
      MVar1 = 0;
    }
    else {
      MVar1 = memory_region_dispatch_read_mips
                        (uc,local_78.mr,(hwaddr)target_as_00,(uint64_t *)&local_78,
                         (uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_32,attrs);
    }
    if (result != (MemTxResult *)0x0) {
      *result = MVar1;
    }
    return (uint)local_78.size;
  }
  __assert_fail("!cache->ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x7b1,
                "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
               );
}

Assistant:

static inline uint32_t glue(address_space_ldl_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result,
    enum device_endian endian)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 4;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (l < 4 || !memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val,
                                        MO_32 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            val = ldl_le_p(ptr);
            break;
        case DEVICE_BIG_ENDIAN:
            val = ldl_be_p(ptr);
            break;
        default:
            val = ldl_p(ptr);
            break;
        }
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}